

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<int,unsigned_long>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,int *t_lhs,int *c_lhs,
          unsigned_long *c_rhs)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 *puVar6;
  arithmetic_error *paVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar9;
  string local_48;
  
  switch(t_oper) {
  case equals:
    b = *c_rhs == (long)*c_lhs;
    goto LAB_001c2ad1;
  case less_than:
    b = (ulong)(long)*c_lhs < *c_rhs;
    goto LAB_001c2ad1;
  case greater_than:
    b = *c_rhs < (ulong)(long)*c_lhs;
    goto LAB_001c2ad1;
  case less_than_equal:
    b = (ulong)(long)*c_lhs <= *c_rhs;
    goto LAB_001c2ad1;
  case greater_than_equal:
    b = *c_rhs <= (ulong)(long)*c_lhs;
    goto LAB_001c2ad1;
  case not_equal:
    b = *c_rhs != (long)*c_lhs;
LAB_001c2ad1:
    BVar9 = const_var((chaiscript *)this,b);
    _Var8._M_pi = BVar9.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_001c2aef;
  default:
    if (t_lhs == (int *)0x0) {
switchD_001c2b3e_caseD_7:
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__bad_cast_00236928;
      __cxa_throw(puVar6,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
    switch(t_oper) {
    case assign:
      iVar5 = (int)*c_rhs;
      goto LAB_001c2bb1;
    default:
      goto switchD_001c2b3e_caseD_7;
    case assign_product:
      iVar5 = *t_lhs * (int)*c_rhs;
LAB_001c2bb1:
      *t_lhs = iVar5;
      break;
    case assign_sum:
      *t_lhs = *t_lhs + (int)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<unsigned_long>(*c_rhs);
      iVar5 = *t_lhs;
      uVar1 = *c_rhs;
      *t_lhs = (int)((ulong)(long)iVar5 / uVar1);
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(long)iVar5 % uVar1);
      break;
    case assign_difference:
      *t_lhs = *t_lhs - (int)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<unsigned_long>(*c_rhs);
      *t_lhs = *t_lhs & (uint)*c_rhs;
      _Var8._M_pi = extraout_RDX;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (uint)*c_rhs;
      break;
    case assign_shift_left:
      *t_lhs = *t_lhs << ((byte)*c_rhs & 0x1f);
      break;
    case assign_shift_right:
      *t_lhs = *t_lhs >> ((byte)*c_rhs & 0x1f);
      break;
    case assign_remainder:
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *c_rhs;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)*t_lhs;
      *t_lhs = SUB164(auVar4 % auVar3,0);
      _Var8._M_pi = SUB168(auVar4 % auVar3,0);
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (uint)*c_rhs;
    }
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    goto LAB_001c2aef;
  case shift_left:
    iVar5 = *c_lhs << ((byte)*c_rhs & 0x1f);
    goto LAB_001c2a97;
  case shift_right:
    iVar5 = *c_lhs >> ((byte)*c_rhs & 0x1f);
LAB_001c2a97:
    local_48._M_dataplus._M_p._0_4_ = iVar5;
    BVar9 = detail::const_var_impl<int>((detail *)this,(int *)&local_48);
    _Var8._M_pi = BVar9.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_001c2aef;
  case remainder:
    if (*c_rhs == 0) {
      paVar7 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar7,&local_48);
      __cxa_throw(paVar7,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)((ulong)(long)*c_lhs % *c_rhs);
    break;
  case bitwise_and:
    local_48._M_dataplus._M_p = (pointer)((long)*c_lhs & *c_rhs);
    break;
  case bitwise_or:
    local_48._M_dataplus._M_p = (pointer)((long)*c_lhs | *c_rhs);
    break;
  case bitwise_xor:
    local_48._M_dataplus._M_p = (pointer)((long)*c_lhs ^ *c_rhs);
    break;
  case sum:
    local_48._M_dataplus._M_p = (pointer)((long)*c_lhs + *c_rhs);
    break;
  case quotient:
    if (*c_rhs == 0) {
      paVar7 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar7,&local_48);
      __cxa_throw(paVar7,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)((ulong)(long)*c_lhs / *c_rhs);
    break;
  case product:
    local_48._M_dataplus._M_p = (pointer)((long)*c_lhs * *c_rhs);
    break;
  case difference:
    local_48._M_dataplus._M_p = (pointer)((long)*c_lhs - *c_rhs);
  }
  BVar9 = detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_48);
  _Var8._M_pi = BVar9.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_001c2aef:
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }